

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_combine.h
# Opt level: O2

size_t spvtools::utils::hash_combine<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                 (size_t hash,
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *vals)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *val;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vals_00;
  
  pvVar1 = (vals->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (vals_00 = (vals->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; vals_00 != pvVar1;
      vals_00 = vals_00 + 1) {
    hash = hash_combine<unsigned_int>(hash,vals_00);
  }
  return hash;
}

Assistant:

inline size_t hash_combine(std::size_t hash, const std::vector<T>& vals) {
  for (const T& val : vals) {
    hash = hash_combine(hash, val);
  }
  return hash;
}